

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_rules.cpp
# Opt level: O2

bool duckdb::LogicalTypeIsValid(LogicalType *type)

{
  LogicalTypeId LVar1;
  bool bVar2;
  idx_t iVar3;
  LogicalType *pLVar4;
  uint uVar5;
  idx_t i;
  idx_t iVar6;
  bool bVar7;
  
  while( true ) {
    LVar1 = type->id_;
    uVar5 = LVar1 - 100;
    if (((8 < uVar5) || ((0x187U >> (uVar5 & 0x1f) & 1) == 0)) && (LVar1 != DECIMAL)) break;
    if ((type->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      return false;
    }
    switch(uVar5) {
    case 0:
      iVar3 = StructType::GetChildCount(type);
      iVar6 = 0;
      do {
        bVar7 = iVar3 == iVar6;
        if (bVar7) {
          return bVar7;
        }
        pLVar4 = StructType::GetChildType(type,iVar6);
        bVar2 = LogicalTypeIsValid(pLVar4);
        iVar6 = iVar6 + 1;
      } while (bVar2);
      return bVar7;
    case 1:
    case 2:
      type = ListType::GetChildType(type);
      break;
    default:
      goto LAB_00211c41;
    case 7:
      iVar3 = UnionType::GetMemberCount(type);
      iVar6 = 0;
      do {
        bVar7 = iVar3 == iVar6;
        if (bVar7) {
          return bVar7;
        }
        pLVar4 = UnionType::GetMemberType(type,iVar6);
        bVar2 = LogicalTypeIsValid(pLVar4);
        iVar6 = iVar6 + 1;
      } while (bVar2);
      return bVar7;
    case 8:
      type = ArrayType::GetChildType(type);
    }
  }
  if (LVar1 - 2 < 2) {
    return false;
  }
  if (LVar1 == INVALID) {
    return false;
  }
LAB_00211c41:
  return true;
}

Assistant:

bool LogicalTypeIsValid(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::UNION:
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
	case LogicalTypeId::ARRAY:
	case LogicalTypeId::DECIMAL:
		// these types are only valid with auxiliary info
		if (!type.AuxInfo()) {
			return false;
		}
		break;
	default:
		break;
	}
	switch (type.id()) {
	case LogicalTypeId::ANY:
	case LogicalTypeId::INVALID:
	case LogicalTypeId::UNKNOWN:
		return false;
	case LogicalTypeId::STRUCT: {
		auto child_count = StructType::GetChildCount(type);
		for (idx_t i = 0; i < child_count; i++) {
			if (!LogicalTypeIsValid(StructType::GetChildType(type, i))) {
				return false;
			}
		}
		return true;
	}
	case LogicalTypeId::UNION: {
		auto member_count = UnionType::GetMemberCount(type);
		for (idx_t i = 0; i < member_count; i++) {
			if (!LogicalTypeIsValid(UnionType::GetMemberType(type, i))) {
				return false;
			}
		}
		return true;
	}
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
		return LogicalTypeIsValid(ListType::GetChildType(type));
	case LogicalTypeId::ARRAY:
		return LogicalTypeIsValid(ArrayType::GetChildType(type));
	default:
		return true;
	}
}